

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * ImGui::GetTopMostPopupModal(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *popup;
  int n;
  ImGuiContext *g;
  
  popup._4_4_ = (GImGui->OpenPopupStack).Size;
  do {
    popup._4_4_ = popup._4_4_ + -1;
    if (popup._4_4_ < 0) {
      return (ImGuiWindow *)0x0;
    }
    pIVar1 = (GImGui->OpenPopupStack).Data[popup._4_4_].Window;
  } while ((pIVar1 == (ImGuiWindow *)0x0) || ((pIVar1->Flags & 0x8000000U) == 0));
  return pIVar1;
}

Assistant:

ImGuiWindow* ImGui::GetTopMostPopupModal()
{
    ImGuiContext& g = *GImGui;
    for (int n = g.OpenPopupStack.Size-1; n >= 0; n--)
        if (ImGuiWindow* popup = g.OpenPopupStack.Data[n].Window)
            if (popup->Flags & ImGuiWindowFlags_Modal)
                return popup;
    return NULL;
}